

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

real __thiscall fasttext::Model::hierarchicalSoftmax(Model *this,int32_t target,real lr)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer piVar3;
  ulong uVar4;
  real rVar5;
  float fVar6;
  
  Vector::zero(&this->grad_);
  pvVar1 = (this->paths).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar3 = pvVar1[target].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar1[target].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) == piVar3) {
    fVar6 = 0.0;
  }
  else {
    pvVar2 = (this->codes).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar6 = 0.0;
    uVar4 = 0;
    do {
      rVar5 = binaryLogistic(this,piVar3[uVar4],
                             (*(ulong *)(*(long *)&pvVar2[target].
                                                   super__Bvector_base<std::allocator<bool>_>.
                                                   _M_impl.super__Bvector_impl_data +
                                        (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0,lr);
      fVar6 = fVar6 + rVar5;
      uVar4 = uVar4 + 1;
      piVar3 = pvVar1[target].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar1[target].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + 8) - (long)piVar3 >> 2));
  }
  return fVar6;
}

Assistant:

real Model::hierarchicalSoftmax(int32_t target, real lr) {
  real loss = 0.0;
  grad_.zero();
  const std::vector<bool>& binaryCode = codes[target];
  const std::vector<int32_t>& pathToRoot = paths[target];
  for (int32_t i = 0; i < pathToRoot.size(); i++) {
    loss += binaryLogistic(pathToRoot[i], binaryCode[i], lr);
  }
  return loss;
}